

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBench.c
# Opt level: O3

int Io_WriteBench(Abc_Ntk_t *pNtk,char *pFileName)

{
  long *plVar1;
  long *plVar2;
  Abc_Obj_t *pNode;
  int iVar3;
  uint uVar4;
  FILE *__stream;
  char *pcVar5;
  char *pcVar6;
  ProgressBar *p;
  Vec_Ptr_t *pVVar7;
  size_t __size;
  long lVar8;
  
  if ((pNtk->ntkFunc != ABC_FUNC_SOP) || (pNtk->ntkType != ABC_NTK_NETLIST)) {
    __assert_fail("Abc_NtkIsSopNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBench.c"
                  ,0x39,"int Io_WriteBench(Abc_Ntk_t *, const char *)");
  }
  iVar3 = Io_WriteBenchCheckNames(pNtk);
  if (iVar3 == 0) {
    pcVar6 = 
    "Io_WriteBench(): Signal names in this benchmark contain parentheses making them impossible to reproduce in the BENCH format. Use \"short_names\".\n"
    ;
    __size = 0x90;
  }
  else {
    __stream = fopen(pFileName,"w");
    if (__stream != (FILE *)0x0) {
      pcVar6 = pNtk->pName;
      pcVar5 = Extra_TimeStamp();
      fprintf(__stream,"# Benchmark \"%s\" written by ABC on %s\n",pcVar6,pcVar5);
      pVVar7 = pNtk->vPis;
      if (0 < pVVar7->nSize) {
        lVar8 = 0;
        do {
          pcVar6 = Abc_ObjName(*(Abc_Obj_t **)
                                (*(long *)(*(long *)(*pVVar7->pArray[lVar8] + 0x20) + 8) +
                                (long)**(int **)((long)pVVar7->pArray[lVar8] + 0x30) * 8));
          fprintf(__stream,"INPUT(%s)\n",pcVar6);
          lVar8 = lVar8 + 1;
          pVVar7 = pNtk->vPis;
        } while (lVar8 < pVVar7->nSize);
      }
      pVVar7 = pNtk->vPos;
      if (0 < pVVar7->nSize) {
        lVar8 = 0;
        do {
          pcVar6 = Abc_ObjName(*(Abc_Obj_t **)
                                (*(long *)(*(long *)(*pVVar7->pArray[lVar8] + 0x20) + 8) +
                                (long)**(int **)((long)pVVar7->pArray[lVar8] + 0x20) * 8));
          fprintf(__stream,"OUTPUT(%s)\n",pcVar6);
          lVar8 = lVar8 + 1;
          pVVar7 = pNtk->vPos;
        } while (lVar8 < pVVar7->nSize);
      }
      pVVar7 = pNtk->vBoxes;
      if (0 < pVVar7->nSize) {
        lVar8 = 0;
        do {
          plVar1 = (long *)pVVar7->pArray[lVar8];
          if ((*(uint *)((long)plVar1 + 0x14) & 0xf) == 8) {
            plVar2 = *(long **)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                               (long)*(int *)plVar1[6] * 8);
            pcVar6 = Abc_ObjName(*(Abc_Obj_t **)
                                  (*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                  (long)*(int *)plVar2[6] * 8));
            plVar1 = *(long **)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                               (long)*(int *)plVar1[4] * 8);
            pcVar5 = Abc_ObjName(*(Abc_Obj_t **)
                                  (*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                  (long)*(int *)plVar1[4] * 8));
            fprintf(__stream,"%-11s = DFF(%s)\n",pcVar6,pcVar5);
            pVVar7 = pNtk->vBoxes;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < pVVar7->nSize);
      }
      p = Extra_ProgressBarStart((FILE *)_stdout,pNtk->vObjs->nSize);
      pVVar7 = pNtk->vObjs;
      if (0 < pVVar7->nSize) {
        lVar8 = 0;
        do {
          pNode = (Abc_Obj_t *)pVVar7->pArray[lVar8];
          if ((pNode != (Abc_Obj_t *)0x0) &&
             (uVar4 = *(uint *)&pNode->field_0x14, (uVar4 & 0xf) == 7)) {
            if ((p == (ProgressBar *)0x0) || (p->nItemsNext <= lVar8)) {
              Extra_ProgressBarUpdate_int(p,(int)lVar8,(char *)0x0);
              uVar4 = *(uint *)&pNode->field_0x14;
            }
            if ((uVar4 & 0xf) != 7) {
              __assert_fail("Abc_ObjIsNode(pNode)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBench.c"
                            ,0x86,"int Io_WriteBenchOneNode(FILE *, Abc_Obj_t *)");
            }
            iVar3 = (pNode->vFanins).nSize;
            if (iVar3 == 1) {
              iVar3 = Abc_NodeIsBuf(pNode);
              pcVar6 = Abc_ObjName((Abc_Obj_t *)
                                   pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
              if (iVar3 == 0) {
                pcVar5 = "%-11s = NOT(";
              }
              else {
                pcVar5 = "%-11s = BUFF(";
              }
              fprintf(__stream,pcVar5,pcVar6);
              pcVar6 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray]
                                  );
            }
            else {
              if (iVar3 == 0) {
                iVar3 = Abc_NodeIsConst1(pNode);
                if (iVar3 == 0) {
                  __assert_fail("Abc_NodeIsConst1(pNode)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBench.c"
                                ,0x8a,"int Io_WriteBenchOneNode(FILE *, Abc_Obj_t *)");
                }
                pcVar6 = Abc_ObjName((Abc_Obj_t *)
                                     pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
                fprintf(__stream,"%-11s",pcVar6);
                fwrite(" = vdd\n",7,1,__stream);
                goto LAB_0033b8ec;
              }
              pcVar6 = Abc_ObjName((Abc_Obj_t *)
                                   pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
              fprintf(__stream,"%-11s",pcVar6);
              pcVar6 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray]
                                  );
              fprintf(__stream," = AND(%s, ",pcVar6);
              pcVar6 = Abc_ObjName((Abc_Obj_t *)
                                   pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[1]]);
            }
            fprintf(__stream,"%s)\n",pcVar6);
          }
LAB_0033b8ec:
          lVar8 = lVar8 + 1;
          pVVar7 = pNtk->vObjs;
        } while (lVar8 < pVVar7->nSize);
      }
      Extra_ProgressBarStop(p);
      if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
        puts("Io_WriteBench: EXDC is not written (warning).");
      }
      fclose(__stream);
      return 1;
    }
    pcVar6 = "Io_WriteBench(): Cannot open the output file.\n";
    __size = 0x2e;
  }
  fwrite(pcVar6,__size,1,_stdout);
  return 0;
}

Assistant:

int Io_WriteBench( Abc_Ntk_t * pNtk, const char * pFileName )
{
    Abc_Ntk_t * pExdc;
    FILE * pFile;
    assert( Abc_NtkIsSopNetlist(pNtk) );
    if ( !Io_WriteBenchCheckNames(pNtk) )
    {
        fprintf( stdout, "Io_WriteBench(): Signal names in this benchmark contain parentheses making them impossible to reproduce in the BENCH format. Use \"short_names\".\n" );
        return 0;
    }
    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Io_WriteBench(): Cannot open the output file.\n" );
        return 0;
    }
    fprintf( pFile, "# Benchmark \"%s\" written by ABC on %s\n", pNtk->pName, Extra_TimeStamp() );
    // write the network
    Io_WriteBenchOne( pFile, pNtk );
    // write EXDC network if it exists
    pExdc = Abc_NtkExdc( pNtk );
    if ( pExdc )
        printf( "Io_WriteBench: EXDC is not written (warning).\n" );
    // finalize the file
    fclose( pFile );
    return 1;
}